

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::to_visualize_mode(Application *this)

{
  Scene *pSVar1;
  _Rb_tree_node_base *p_Var2;
  
  if (*(int *)&(this->super_Renderer).field_0xc != 3) {
    set_up_pathtracer(this);
    PathTracer::stop(this->pathtracer);
    PathTracer::start_visualizing(this->pathtracer);
    *(undefined4 *)&(this->super_Renderer).field_0xc = 3;
    this->isGhosted = false;
    pSVar1 = this->scene;
    for (p_Var2 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      *(undefined1 *)(*(long *)(p_Var2 + 1) + 0xe9) = 0;
    }
  }
  return;
}

Assistant:

void Application::to_visualize_mode() {
  if (mode == VISUALIZE_MODE) return;
  set_up_pathtracer();
  pathtracer->stop();
  pathtracer->start_visualizing();
  mode = VISUALIZE_MODE;
  setGhosted(false);
}